

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O0

void R_DrawSpanMaskedP_C(void)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  lighttable_t *plVar4;
  dsfixed_t dVar5;
  dsfixed_t dVar6;
  BYTE *pBVar7;
  byte bVar8;
  BYTE texdata_1;
  int xmask;
  BYTE xshift;
  BYTE yshift;
  int iStack_34;
  BYTE texdata;
  int spot;
  int count;
  BYTE *colormap;
  BYTE *source;
  BYTE *dest;
  dsfixed_t ystep;
  dsfixed_t xstep;
  dsfixed_t yfrac;
  dsfixed_t xfrac;
  
  pBVar7 = ds_source;
  dVar6 = ds_ystep;
  dVar5 = ds_xstep;
  plVar4 = ds_colormap;
  xstep = ds_xfrac;
  ystep = ds_yfrac;
  source = dc_destorg + (ylookup[ds_y] + ds_x1);
  iStack_34 = (ds_x2 - ds_x1) + 1;
  if ((ds_xbits == 6) && (ds_ybits == 6)) {
    do {
      bVar1 = pBVar7[(int)((xstep >> 0x14 & 0xfc0) + (ystep >> 0x1a))];
      if (bVar1 != 0) {
        *source = plVar4[bVar1];
      }
      source = source + 1;
      xstep = dVar5 + xstep;
      ystep = dVar6 + ystep;
      iStack_34 = iStack_34 + -1;
    } while (iStack_34 != 0);
  }
  else {
    bVar1 = (byte)ds_ybits;
    bVar8 = 0x20 - bVar1;
    bVar3 = (byte)ds_xbits;
    do {
      bVar2 = pBVar7[(int)((xstep >> (bVar8 - bVar3 & 0x1f) &
                           (1 << (bVar3 & 0x1f)) + -1 << (bVar1 & 0x1f)) + (ystep >> (bVar8 & 0x1f))
                          )];
      if (bVar2 != 0) {
        *source = plVar4[bVar2];
      }
      source = source + 1;
      xstep = dVar5 + xstep;
      ystep = dVar6 + ystep;
      iStack_34 = iStack_34 + -1;
    } while (iStack_34 != 0);
  }
  return;
}

Assistant:

void R_DrawSpanMaskedP_C (void)
{
	dsfixed_t			xfrac;
	dsfixed_t			yfrac;
	dsfixed_t			xstep;
	dsfixed_t			ystep;
	BYTE*				dest;
	const BYTE*			source = ds_source;
	const BYTE*			colormap = ds_colormap;
	int 				count;
	int 				spot;

	xfrac = ds_xfrac;
	yfrac = ds_yfrac;

	dest = ylookup[ds_y] + ds_x1 + dc_destorg;

	count = ds_x2 - ds_x1 + 1;

	xstep = ds_xstep;
	ystep = ds_ystep;

	if (ds_xbits == 6 && ds_ybits == 6)
	{
		// 64x64 is the most common case by far, so special case it.
		do
		{
			BYTE texdata;

			spot = ((xfrac>>(32-6-6))&(63*64)) + (yfrac>>(32-6));
			texdata = source[spot];
			if (texdata != 0)
			{
				*dest = colormap[texdata];
			}
			dest++;
			xfrac += xstep;
			yfrac += ystep;
		} while (--count);
	}
	else
	{
		BYTE yshift = 32 - ds_ybits;
		BYTE xshift = yshift - ds_xbits;
		int xmask = ((1 << ds_xbits) - 1) << ds_ybits;
		do
		{
			BYTE texdata;
		
			spot = ((xfrac >> xshift) & xmask) + (yfrac >> yshift);
			texdata = source[spot];
			if (texdata != 0)
			{
				*dest = colormap[texdata];
			}
			dest++;
			xfrac += xstep;
			yfrac += ystep;
		} while (--count);
	}
}